

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsComponentAddDomain(FmsComponent comp,FmsDomain domain)

{
  FmsInt FVar1;
  FmsInt FVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  _FmsPart_private *__ptr;
  FmsInt FVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (comp == (FmsComponent)0x0) {
    return 1;
  }
  if (domain == (FmsDomain)0x0) {
    iVar5 = 2;
  }
  else {
    FVar1 = comp->dim;
    FVar2 = domain->dim;
    iVar5 = 3;
    if (FVar1 == FVar2 || FVar1 == 0x7f) {
      uVar3 = comp->num_parts;
      __ptr = comp->parts;
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        uVar4 = uVar7 * 2;
      } while (uVar7 < uVar3 + 1);
      if (uVar3 <= uVar7 >> 1) {
        __ptr = (_FmsPart_private *)realloc(__ptr,uVar7 * 0xe8);
        if (__ptr == (_FmsPart_private *)0x0) {
          return 4;
        }
        comp->parts = __ptr;
      }
      memset(__ptr + uVar3,0,0xe8);
      __ptr[uVar3].domain = domain;
      FVar6 = comp->num_main_entities;
      lVar8 = 0;
      do {
        lVar9 = *(long *)((long)domain->num_entities + lVar8);
        *(long *)((long)__ptr[uVar3].num_entities + lVar8) = lVar9;
        if (*(FmsInt *)((long)FmsEntityDim + lVar8) != FVar2) {
          lVar9 = 0;
        }
        FVar6 = FVar6 + lVar9;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x40);
      if (FVar1 == 0x7f) {
        comp->dim = FVar2;
      }
      comp->num_main_entities = FVar6;
      comp->num_parts = uVar3 + 1;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int FmsComponentAddDomain(FmsComponent comp, FmsDomain domain) {
  if (!comp) { E_RETURN(1); }
  if (!domain) { E_RETURN(2); }
  const FmsInt num_parts = comp->num_parts;
  const FmsInt comp_dim = comp->dim;
  const FmsInt dim = domain->dim;
  if (comp_dim != FMS_INVALID_DIM && comp_dim != dim) { E_RETURN(3); }
  struct _FmsPart_private *parts = comp->parts;
  // Reallocate comp->parts, if necessary
  FmsInt nc = NextPow2(num_parts + 1);
  if (num_parts <= nc/2) {
    parts = realloc(parts, nc*sizeof(*parts));
    if (parts == NULL) { E_RETURN(4); }
    comp->parts = parts;
  }
  struct _FmsPart_private *part = parts + num_parts;
  // Initialize part, counting the number of main entities
  memset(part, 0, sizeof(*part));
  part->domain = domain;
  FmsInt num_main_entities = comp->num_main_entities;
  for (FmsInt t = 0; t < FMS_NUM_ENTITY_TYPES; t++) {
    FmsInt num_entities = domain->num_entities[t];
    part->num_entities[t] = num_entities;
    if (FmsEntityDim[t] == dim) {
      num_main_entities += num_entities;
    }
    // the value of part->entities_ids_type[t] is not used
    // part->entities_ids[t] is already set to NULL
    // part->orientations[t] is already set to NULL
  }
  // Update comp
  if (comp_dim == FMS_INVALID_DIM) {
    comp->dim = dim;
  }
  comp->num_main_entities = num_main_entities;
  comp->num_parts = num_parts + 1;
  return 0;
}